

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit.hpp
# Opt level: O0

test_case *
boost::unit_test::make_test_case
          (function<void_()> *test_func,const_string *tc_name,const_string *tc_file,size_t tc_line)

{
  test_case *this;
  basic_cstring<const_char> *in_RDX;
  std_string *in_RSI;
  const_string *in_RDI;
  basic_cstring<const_char> local_80 [2];
  basic_cstring<const_char> local_60;
  function<void_()> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffb8;
  const_string *in_stack_ffffffffffffffc0;
  const_string *in_stack_ffffffffffffffc8;
  test_case *in_stack_ffffffffffffffd0;
  
  this = (test_case *)operator_new(0x138);
  basic_cstring<const_char>::basic_cstring(&local_60,(basic_cstring<const_char> *)in_RSI);
  ut_detail::normalize_test_case_name_abi_cxx11_(in_RDI);
  basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this,in_RSI);
  basic_cstring<const_char>::basic_cstring(local_80,in_RDX);
  test_case::test_case
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  return this;
}

Assistant:

inline test_case*
make_test_case( boost::function<void ()> const& test_func, const_string tc_name, const_string tc_file, std::size_t tc_line )
{
    return new test_case( ut_detail::normalize_test_case_name( tc_name ), tc_file, tc_line, test_func );
}